

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::file_renamed_alert::~file_renamed_alert(file_renamed_alert *this)

{
  file_renamed_alert *this_local;
  
  ~file_renamed_alert(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

struct TORRENT_EXPORT file_renamed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT file_renamed_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, string_view n, string_view old, file_index_t idx);

		TORRENT_DEFINE_ALERT_PRIO(file_renamed_alert, 7, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		// returns the new and previous file name, respectively.
		char const* new_name() const;
		char const* old_name() const;

		// refers to the index of the file that was renamed,
		file_index_t const index;
	private:
		aux::allocation_slot m_name_idx;
		aux::allocation_slot m_old_name_idx;
#if TORRENT_ABI_VERSION == 1

#include "libtorrent/aux_/disable_warnings_push.hpp"

	public:
		TORRENT_DEPRECATED std::string name;

#include "libtorrent/aux_/disable_warnings_pop.hpp"

#endif
	}